

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.h
# Opt level: O2

void __thiscall TCPSocket::IOError::IOError(IOError *this,string *reason,int code)

{
  allocator local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::__cxx11::string::string((string *)&local_40,"IO exception",&local_61);
  std::operator+(&local_60,&local_40,reason);
  TCPSocketError::TCPSocketError(&this->super_TCPSocketError,&local_60,code);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  *(undefined ***)&this->super_TCPSocketError = &PTR__TCPSocketError_00120990;
  return;
}

Assistant:

IOError(std::string reason="", int code=0) : TCPSocketError(std::string("IO exception") + reason, code){}